

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

cbtScalar __thiscall
cbtCollisionWorld::rayTestSingleInternal::BridgeTriangleRaycastCallback::reportHit
          (BridgeTriangleRaycastCallback *this,cbtVector3 *hitNormalLocal,cbtScalar hitFraction,
          int partId,int triangleIndex)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cbtScalar extraout_XMM0_Da;
  LocalShapeInfo shapeInfo;
  int local_30;
  int local_2c;
  cbtCollisionObject *local_28;
  int *local_20;
  undefined1 local_18 [16];
  cbtScalar local_8;
  
  local_20 = &local_30;
  fVar1 = hitNormalLocal->m_floats[1];
  cVar2 = hitNormalLocal->m_floats[0];
  cVar3 = hitNormalLocal->m_floats[2];
  local_28 = this->m_collisionObject;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->m_colObjWorldTransform).m_basis.m_el[0].
                                                  m_floats[1])),ZEXT416((uint)cVar2),
                           ZEXT416((uint)(this->m_colObjWorldTransform).m_basis.m_el[0].m_floats[0])
                          );
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->m_colObjWorldTransform).m_basis.m_el[1].
                                                  m_floats[1])),ZEXT416((uint)cVar2),
                           ZEXT416((uint)(this->m_colObjWorldTransform).m_basis.m_el[1].m_floats[0])
                          );
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->m_colObjWorldTransform).m_basis.m_el[2].
                                                  m_floats[1])),ZEXT416((uint)cVar2),
                           ZEXT416((uint)(this->m_colObjWorldTransform).m_basis.m_el[2].m_floats[0])
                          );
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)cVar3),
                           ZEXT416((uint)(this->m_colObjWorldTransform).m_basis.m_el[0].m_floats[2])
                          );
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)cVar3),
                           ZEXT416((uint)(this->m_colObjWorldTransform).m_basis.m_el[1].m_floats[2])
                          );
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar3),
                           ZEXT416((uint)(this->m_colObjWorldTransform).m_basis.m_el[2].m_floats[2])
                          );
  auVar4 = vinsertps_avx(auVar4,auVar5,0x10);
  local_18 = vinsertps_avx(auVar4,auVar6,0x28);
  local_30 = partId;
  local_2c = triangleIndex;
  local_8 = hitFraction;
  (*this->m_resultCallback->_vptr_RayResultCallback[3])(this->m_resultCallback,&local_28,1);
  return extraout_XMM0_Da;
}

Assistant:

virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
				{
					cbtCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = partId;
					shapeInfo.m_triangleIndex = triangleIndex;

					cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

					cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
															   &shapeInfo,
															   hitNormalWorld,
															   hitFraction);

					bool normalInWorldSpace = true;
					return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
				}